

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O2

void nukedopl3_update(void *chip,UINT32 samples,DEV_SMPL **out)

{
  undefined8 in_RAX;
  int iVar1;
  int iVar2;
  ulong uVar4;
  int32_t buffers [2];
  undefined8 local_38;
  ulong uVar3;
  
  uVar3 = (ulong)samples;
  if (*(char *)((long)chip + 0x119b) == '\0') {
    local_38 = in_RAX;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      NOPL3_GenerateResampled((opl3_chip *)chip,(int32_t *)&local_38);
      (*out)[uVar4] = *(int *)((long)chip + 0x11ec) * (int)local_38 >> 0xc;
      out[1][uVar4] = *(int *)((long)chip + 0x11f0) * local_38._4_4_ >> 0xc;
    }
  }
  else {
    memset(*out,0,uVar3 << 2);
    memset(out[1],0,uVar3 << 2);
    iVar1 = *(int *)((long)chip + 0x11c0);
    if (iVar1 == 0x400) {
      while ((iVar1 = (int)uVar3, uVar3 = (ulong)(iVar1 - 1), iVar1 != 0 &&
             ((*(byte *)((long)chip + (ulong)*(uint *)((long)chip + 0x1200) * 0x10 + 0x1219) & 2) !=
              0))) {
        NOPL3_Generate4Ch((opl3_chip *)chip,(int32_t *)((long)chip + 0x11d8));
      }
    }
    else {
      iVar2 = samples * 0x400 + *(int *)((long)chip + 0x11c4);
      while (*(int *)((long)chip + 0x11c4) = iVar2, iVar1 <= iVar2) {
        if ((*(byte *)((long)chip + (ulong)*(uint *)((long)chip + 0x1200) * 0x10 + 0x1219) & 2) == 0
           ) {
          *(undefined4 *)((long)chip + 0x11c4) = 0;
          return;
        }
        NOPL3_Generate4Ch((opl3_chip *)chip,(int32_t *)((long)chip + 0x11d8));
        iVar1 = *(int *)((long)chip + 0x11c0);
        iVar2 = *(int *)((long)chip + 0x11c4) - iVar1;
      }
    }
  }
  return;
}

Assistant:

void nukedopl3_update(void *chip, UINT32 samples, DEV_SMPL **out)
{
	opl3_chip* opl3 = (opl3_chip*)chip;
	int32_t buffers[2];
	UINT32 i;

	if (opl3->isDisabled)
	{
		// Speed hack for possibly unused FM-part of OPL4 chip
		memset(out[0], 0, samples * sizeof(DEV_SMPL));
		memset(out[1], 0, samples * sizeof(DEV_SMPL));
#ifdef NOPL_ENABLE_WRITEBUF
		// make sure that the enqueued register writes get processed properly
		if (opl3->rateratio == (1 << RSM_FRAC))
		{
			for( i=0; i < samples ; i++ )
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
					break;
				NOPL3_Generate4Ch(opl3, opl3->samples);
			}
		}
		else
		{
			opl3->samplecnt += samples << RSM_FRAC;
			while(opl3->samplecnt >= opl3->rateratio)
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
				{
					opl3->samplecnt = 0;
					break;
				}
				NOPL3_Generate4Ch(opl3, opl3->samples);
				opl3->samplecnt -= opl3->rateratio;
			}
		}
#endif
		return;
	}

	for( i=0; i < samples ; i++ )
	{
		NOPL3_GenerateResampled(opl3, buffers);
		out[0][i] = (buffers[0] * opl3->masterVolL) >> 12;
		out[1][i] = (buffers[1] * opl3->masterVolR) >> 12;
	}
}